

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

uint32_t asmjit::anon_unknown_32::CodeHolder_hashNameAndFixLen(char *name,size_t *nameLength)

{
  byte bVar1;
  size_t sVar2;
  long lVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  long lVar6;
  size_t i;
  size_t sVar7;
  
  sVar2 = *nameLength;
  if (sVar2 == 0) {
    return 0;
  }
  if (sVar2 != 0xffffffffffffffff) {
    sVar7 = 0;
    uVar5 = 0;
    do {
      if (name[sVar7] == 0) {
        return 0x11;
      }
      uVar5 = uVar5 * 0x1003f + (uint)(byte)name[sVar7];
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
    return uVar5;
  }
  lVar3 = -1;
  uVar5 = 0;
  do {
    uVar4 = uVar5;
    lVar6 = lVar3;
    bVar1 = name[lVar6 + 1];
    lVar3 = lVar6 + 1;
    uVar5 = uVar4 * 0x1003f + (uint)bVar1;
  } while (bVar1 != 0);
  *nameLength = (lVar6 + 2) - (ulong)(bVar1 == 0);
  return uVar4;
}

Assistant:

static uint32_t CodeHolder_hashNameAndFixLen(const char* name, size_t& nameLength) noexcept {
  uint32_t hVal = 0;
  if (nameLength == Globals::kInvalidIndex) {
    size_t i = 0;
    for (;;) {
      uint8_t c = static_cast<uint8_t>(name[i]);
      if (!c) break;
      hVal = Utils::hashRound(hVal, c);
      i++;
    }
    nameLength = i;
  }
  else {
    for (size_t i = 0; i < nameLength; i++) {
      uint8_t c = static_cast<uint8_t>(name[i]);
      if (ASMJIT_UNLIKELY(!c)) return DebugUtils::errored(kErrorInvalidLabelName);
      hVal = Utils::hashRound(hVal, c);
    }
  }
  return hVal;
}